

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

char * search_header(curl_slist *hdrlist,char *hdr,size_t len)

{
  char *local_28;
  char *value;
  size_t len_local;
  char *hdr_local;
  curl_slist *hdrlist_local;
  
  local_28 = (char *)0x0;
  for (hdr_local = (char *)hdrlist; local_28 == (char *)0x0 && hdr_local != (char *)0x0;
      hdr_local = *(char **)(hdr_local + 8)) {
    local_28 = match_header((curl_slist *)hdr_local,hdr,len);
  }
  return local_28;
}

Assistant:

static char *search_header(struct curl_slist *hdrlist,
                           const char *hdr, size_t len)
{
  char *value = NULL;

  for(; !value && hdrlist; hdrlist = hdrlist->next)
    value = match_header(hdrlist, hdr, len);

  return value;
}